

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

QPoint __thiscall
QMdi::MinOverlapPlacer::place(MinOverlapPlacer *this,QSize *size,QList<QRect> *rects,QRect *domain)

{
  long lVar1;
  ulong uVar2;
  QPoint QVar3;
  ulong uVar4;
  QRect *pQVar5;
  QList<QRect> *__range1;
  QRect *pQVar6;
  long in_FS_OFFSET;
  QList<QRect> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0;
  if (0 < (size->wd).m_i) {
    uVar2 = 0;
    if ((size->ht).m_i < 1) goto LAB_0043ea31;
    uVar4 = 0;
    if ((domain->x1).m_i <= (domain->x2).m_i) {
      uVar2 = 0;
      if ((domain->y1).m_i <= (domain->y2).m_i) {
        lVar1 = (rects->d).size;
        if (lVar1 != 0) {
          pQVar6 = (rects->d).ptr;
          pQVar5 = pQVar6 + lVar1;
          uVar4 = 0;
          do {
            if ((pQVar6->x2).m_i < (pQVar6->x1).m_i) goto LAB_0043ea2f;
            uVar2 = 0;
            if ((pQVar6->y2).m_i < (pQVar6->y1).m_i) goto LAB_0043ea31;
            pQVar6 = pQVar6 + 1;
          } while (pQVar6 != pQVar5);
        }
        local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_38.d.ptr = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
        getCandidatePlacements(&local_38,size,rects,domain);
        QVar3 = findBestPlacement(domain,rects,&local_38);
        if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,0x10,0x10);
          }
        }
        uVar4 = (ulong)QVar3 & 0xffffffff00000000;
        uVar2 = (ulong)QVar3 & 0xffffffff;
      }
      goto LAB_0043ea31;
    }
  }
LAB_0043ea2f:
  uVar4 = 0;
  uVar2 = 0;
LAB_0043ea31:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QPoint)(uVar2 | uVar4);
  }
  __stack_chk_fail();
}

Assistant:

QPoint MinOverlapPlacer::place(const QSize &size, const QList<QRect> &rects,
                               const QRect &domain) const
{
    if (size.isEmpty() || !domain.isValid())
        return QPoint();
    for (const QRect &rect : rects) {
        if (!rect.isValid())
            return QPoint();
    }

    QList<QRect> candidates = getCandidatePlacements(size, rects, domain);
    return findBestPlacement(domain, rects, candidates);
}